

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_next(lua_State *L,Table *t,StkId key)

{
  long lVar1;
  uint uVar2;
  TValue *pTVar3;
  uint uVar4;
  Node *n;
  Node *pNVar5;
  ulong uVar6;
  TValue *io;
  long lVar7;
  
  uVar2 = luaH_realasize(t);
  uVar4 = 0;
  if (((key->val).tt_ & 0xf) != 0) {
    uVar4 = 0;
    if (((key->val).tt_ == 3) && (uVar4 = (uint)*(long *)key, *(long *)key - 1U >> 0x1f != 0)) {
      uVar4 = 0;
    }
    if (uVar2 <= uVar4 - 1) {
      pTVar3 = getgeneric(t,&key->val,1);
      if (pTVar3->tt_ == ' ') {
        luaG_runerror(L,"invalid key to \'next\'");
      }
      uVar4 = uVar2 + (int)(((long)pTVar3 - (long)t->node) / 0x18) + 1;
    }
  }
  uVar6 = (ulong)uVar4;
  lVar1 = uVar6 * 0x10 + -0x10;
  do {
    lVar7 = lVar1;
    if (uVar2 <= uVar6) {
      uVar2 = (int)uVar6 - uVar2;
      do {
        if (1 << (t->lsizenode & 0x1f) <= (int)uVar2) {
          return 0;
        }
        uVar6 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while ((*(byte *)((long)t->node + uVar6 * 0x18 + 8) & 0xf) == 0);
      pNVar5 = t->node + uVar6;
      (key->val).value_ = (pNVar5->u).key_val;
      (key->val).tt_ = (pNVar5->u).key_tt;
      goto LAB_00110e9b;
    }
    uVar6 = uVar6 + 1;
    lVar1 = lVar7 + 0x10;
  } while (((&t->array[1].tt_)[lVar7] & 0xf) == 0);
  (key->val).value_.i = uVar6 & 0xffffffff;
  (key->val).tt_ = '\x03';
  pNVar5 = (Node *)((long)&t->array[1].value_ + lVar7);
LAB_00110e9b:
  key[1].val.value_ = (pNVar5->u).value_;
  *(lu_byte *)((long)key + 0x18) = (pNVar5->u).tt_;
  return 1;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = luaH_realasize(t);
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    if (!isempty(&t->array[i])) {  /* a non-empty entry? */
      setivalue(s2v(key), i + 1);
      setobj2s(L, key + 1, &t->array[i]);
      return 1;
    }
  }
  for (i -= asize; cast_int(i) < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}